

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O3

size_t duckdb_zstd::ZSTD_entropyCompressSeqStore
                 (seqStore_t *seqStorePtr,ZSTD_entropyCTables_t *prevEntropy,
                 ZSTD_entropyCTables_t *nextEntropy,ZSTD_CCtx_params *cctxParams,void *dst,
                 size_t dstCapacity,size_t srcSize,void *entropyWorkspace,size_t entropyWkspSize,
                 int bmi2)

{
  ZSTD_fseCTables_t *nextEntropy_00;
  ZSTD_strategy ZVar1;
  seqDef *sequences;
  seqDef *psVar2;
  BYTE *ofCodeTable;
  BYTE *llCodeTable;
  BYTE *mlCodeTable;
  uint disableLiteralCompression;
  size_t err_code;
  ulong uVar3;
  byte *pbVar4;
  byte bVar5;
  size_t srcSize_00;
  uint suspectUncompressible;
  ulong nbSeq;
  ZSTD_symbolEncodingTypeStats_t stats;
  
  sequences = seqStorePtr->sequencesStart;
  psVar2 = seqStorePtr->sequences;
  nbSeq = (long)psVar2 - (long)sequences >> 3;
  srcSize_00 = (long)seqStorePtr->lit - (long)seqStorePtr->litStart;
  ZVar1 = (cctxParams->cParams).strategy;
  ofCodeTable = seqStorePtr->ofCode;
  llCodeTable = seqStorePtr->llCode;
  mlCodeTable = seqStorePtr->mlCode;
  if (psVar2 == sequences) {
    suspectUncompressible = 1;
  }
  else {
    suspectUncompressible = (uint)(0x13 < srcSize_00 / nbSeq);
  }
  disableLiteralCompression = 0;
  if (cctxParams->literalCompressionMode != ZSTD_ps_enable) {
    if (cctxParams->literalCompressionMode == ZSTD_ps_disable) {
      disableLiteralCompression = 1;
    }
    else if (ZVar1 == ZSTD_fast) {
      disableLiteralCompression = (uint)((cctxParams->cParams).targetLength != 0);
    }
  }
  uVar3 = ZSTD_compressLiterals
                    (dst,dstCapacity,seqStorePtr->litStart,srcSize_00,
                     (void *)((long)entropyWorkspace + 0xd4),0x2204,&prevEntropy->huf,
                     &nextEntropy->huf,ZVar1,disableLiteralCompression,suspectUncompressible,
                     (int)entropyWkspSize);
  if (0xffffffffffffff88 < uVar3) goto LAB_0124d54f;
  if ((long)(dstCapacity - uVar3) < 4) {
    if (srcSize <= dstCapacity) {
      return 0;
    }
    return 0xffffffffffffffba;
  }
  pbVar4 = (byte *)(uVar3 + (long)dst);
  if (nbSeq < 0x80) {
    *pbVar4 = (byte)nbSeq;
    pbVar4 = pbVar4 + 1;
  }
  else if (nbSeq < 0x7f00) {
    *pbVar4 = (byte)(nbSeq >> 8) | 0x80;
    pbVar4[1] = (byte)nbSeq;
    pbVar4 = pbVar4 + 2;
  }
  else {
    *pbVar4 = 0xff;
    *(short *)(pbVar4 + 1) = (short)nbSeq + -0x7f00;
    pbVar4 = pbVar4 + 3;
  }
  nextEntropy_00 = &nextEntropy->fse;
  if (psVar2 == sequences) {
    switchD_00b041bd::default(nextEntropy_00,&prevEntropy->fse,0xde0);
  }
  else {
    ZSTD_buildSequencesStatistics
              (&stats,seqStorePtr,nbSeq,&prevEntropy->fse,nextEntropy_00,pbVar4 + 1,
               (BYTE *)((long)dst + dstCapacity),ZVar1,(uint *)entropyWorkspace,
               (void *)((long)entropyWorkspace + 0xd4),0x2204);
    uVar3 = stats.size;
    if (0xffffffffffffff88 < stats.size) goto LAB_0124d54f;
    *pbVar4 = (char)(stats.Offtype << 4) + (char)(stats.LLtype << 6) + (char)stats.MLtype * '\x04';
    pbVar4 = pbVar4 + 1 + stats.size;
    uVar3 = ZSTD_encodeSequences
                      (pbVar4,(long)((long)dst + dstCapacity) - (long)pbVar4,
                       (nextEntropy->fse).matchlengthCTable,mlCodeTable,
                       nextEntropy_00->offcodeCTable,ofCodeTable,(nextEntropy->fse).litlengthCTable,
                       llCodeTable,sequences,nbSeq,stats.longOffsets,(int)entropyWkspSize);
    if (0xffffffffffffff88 < uVar3) goto LAB_0124d54f;
    if ((stats.lastCountSize != 0) && (stats.lastCountSize + uVar3 < 4)) {
      return 0;
    }
    pbVar4 = pbVar4 + uVar3;
  }
  uVar3 = (long)pbVar4 - (long)dst;
  if ((long)pbVar4 - (long)dst == 0) {
    return 0;
  }
LAB_0124d54f:
  if ((srcSize <= dstCapacity) && (uVar3 == 0xffffffffffffffba)) {
    return 0;
  }
  if (0xffffffffffffff88 < uVar3) {
    return uVar3;
  }
  ZVar1 = (cctxParams->cParams).strategy;
  bVar5 = 6;
  if (7 < (int)ZVar1) {
    bVar5 = (char)ZVar1 - 1;
  }
  if ((srcSize - (srcSize >> (bVar5 & 0x3f))) - 2 <= uVar3) {
    return 0;
  }
  return uVar3;
}

Assistant:

MEM_STATIC size_t
ZSTD_entropyCompressSeqStore(
                    const seqStore_t* seqStorePtr,
                    const ZSTD_entropyCTables_t* prevEntropy,
                          ZSTD_entropyCTables_t* nextEntropy,
                    const ZSTD_CCtx_params* cctxParams,
                          void* dst, size_t dstCapacity,
                          size_t srcSize,
                          void* entropyWorkspace, size_t entropyWkspSize,
                          int bmi2)
{
    size_t const cSize = ZSTD_entropyCompressSeqStore_internal(
                            seqStorePtr, prevEntropy, nextEntropy, cctxParams,
                            dst, dstCapacity,
                            entropyWorkspace, entropyWkspSize, bmi2);
    if (cSize == 0) return 0;
    /* When srcSize <= dstCapacity, there is enough space to write a raw uncompressed block.
     * Since we ran out of space, block must be not compressible, so fall back to raw uncompressed block.
     */
    if ((cSize == ERROR(dstSize_tooSmall)) & (srcSize <= dstCapacity)) {
        DEBUGLOG(4, "not enough dstCapacity (%zu) for ZSTD_entropyCompressSeqStore_internal()=> do not compress block", dstCapacity);
        return 0;  /* block not compressed */
    }
    FORWARD_IF_ERROR(cSize, "ZSTD_entropyCompressSeqStore_internal failed");

    /* Check compressibility */
    {   size_t const maxCSize = srcSize - ZSTD_minGain(srcSize, cctxParams->cParams.strategy);
        if (cSize >= maxCSize) return 0;  /* block not compressed */
    }
    DEBUGLOG(5, "ZSTD_entropyCompressSeqStore() cSize: %zu", cSize);
    /* libzstd decoder before  > v1.5.4 is not compatible with compressed blocks of size ZSTD_BLOCKSIZE_MAX exactly.
     * This restriction is indirectly already fulfilled by respecting ZSTD_minGain() condition above.
     */
    assert(cSize < ZSTD_BLOCKSIZE_MAX);
    return cSize;
}